

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O2

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::UnitType,_char> *ut)

{
  UnitType UVar1;
  type *ptVar2;
  ostream *poVar3;
  JSON<char[20],_char> local_20;
  char local_d;
  UnitType local_c;
  
  UVar1 = *ut->object;
  switch(UVar1) {
  case DW_UT_compile:
    local_c = (uint)(uint3)local_c._1_3_ << 8;
    local_20.object = (char (*) [20])0x18076b;
    goto LAB_00161a5e;
  case DW_UT_type:
    local_20.context = (char *)&local_c;
    local_c = (uint)(uint3)local_c._1_3_ << 8;
    local_20.object = (char (*) [20])0x180779;
    poVar3 = operator<<(os,(JSON<char[11],_char> *)&local_20);
    break;
  case DW_UT_partial:
    local_c = (uint)(uint3)local_c._1_3_ << 8;
    local_20.object = (char (*) [20])0x180784;
    goto LAB_00161a5e;
  case DW_UT_skeleton:
    local_20.context = (char *)&local_c;
    local_c = (uint)(uint3)local_c._1_3_ << 8;
    local_20.object = (char (*) [20])0x180792;
    poVar3 = operator<<(os,(JSON<char[15],_char> *)&local_20);
    break;
  case DW_UT_split_compile:
    local_20.context = (char *)&local_c;
    local_c = (uint)(uint3)local_c._1_3_ << 8;
    local_20.object = (char (*) [20])0x1807a1;
    poVar3 = operator<<(os,&local_20);
    break;
  case DW_UT_split_type:
    local_20.context = (char *)&local_c;
    local_c = (uint)(uint3)local_c._1_3_ << 8;
    local_20.object = (char (*) [20])0x1807b5;
    poVar3 = operator<<(os,(JSON<char[17],_char> *)&local_20);
    break;
  default:
    if (UVar1 == DW_UT_lo_user) {
      local_c = (uint)(uint3)local_c._1_3_ << 8;
      local_20.object = (char (*) [20])0x1807c6;
    }
    else {
      if (UVar1 != DW_UT_hi_user) {
        local_20.object = (char (*) [20])&local_c;
        local_20.context = &local_d;
        local_d = '\0';
        local_c = UVar1;
        ptVar2 = operator<<(os,(JSON<int,_char> *)&local_20);
        return ptVar2;
      }
      local_c = (uint)(uint3)local_c._1_3_ << 8;
      local_20.object = (char (*) [20])0x1807d4;
    }
LAB_00161a5e:
    local_20.context = (char *)&local_c;
    poVar3 = operator<<(os,(JSON<char[14],_char> *)&local_20);
  }
  return poVar3;
}

Assistant:

std::ostream & operator << (std::ostream &os, const JSON<Dwarf::UnitType> &ut) {
#define DWARF_UNIT_TYPE(x,y) case Dwarf::x: return os << json(#x);
    switch (ut.object) {
#include "libpstack/dwarf/unittype.h"
    default: return os << json(int(ut.object));
    }
#undef DWARF_UNIT_TYPE
}